

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegExp.cc
# Opt level: O0

void __thiscall flow::util::RegExp::RegExp(RegExp *this,RegExp *v)

{
  RegExp *v_local;
  RegExp *this_local;
  
  std::__cxx11::string::string((string *)this,(string *)v);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            (&this->re_,&v->re_);
  return;
}

Assistant:

RegExp::RegExp(RegExp&& v)
    : pattern_(std::move(v.pattern_)),
      re_(std::move(v.re_)) {
}